

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::_makeunreachable(TranslateToFuzzReader *this)

{
  WeightedOption weightedOption;
  WeightedOption rest;
  WeightedOption rest_1;
  WeightedOption rest_2;
  WeightedOption rest_3;
  WeightedOption rest_4;
  WeightedOption rest_5;
  WeightedOption rest_6;
  WeightedOption rest_7;
  FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *this_00;
  code *pcVar1;
  Expression *pEVar2;
  long extraout_RDX;
  long *plVar3;
  _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>_>
  local_158;
  code *local_128;
  undefined8 uStack_120;
  code *local_118;
  undefined8 uStack_110;
  code *local_108;
  undefined8 uStack_100;
  code *local_f8;
  undefined8 uStack_f0;
  code *local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  code *local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  code *local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  code *local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  code *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  code *local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  code *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  code *local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  code *local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  local_158._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_158._M_impl.super__Rb_tree_header._M_header;
  local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_158._M_impl._0_8_ = 0;
  local_158._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_158._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_158._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e8 = makeLocalSet;
  uStack_e0 = 0;
  local_d0 = makeBlock;
  uStack_c8 = 0;
  local_b8 = makeIf;
  uStack_b0 = 0;
  local_d8 = 4;
  local_a0 = makeLoop;
  uStack_98 = 0;
  local_88 = makeBreak;
  uStack_80 = 0;
  local_c0 = 2;
  local_a8 = 2;
  local_70 = makeStore;
  uStack_68 = 0;
  local_58 = makeUnary;
  uStack_50 = 0;
  local_90 = 2;
  local_78 = 2;
  local_40 = makeBinary;
  uStack_38 = 0;
  local_28 = makeUnreachable;
  uStack_20 = 0;
  local_60 = 2;
  local_48 = 2;
  local_128 = makeSelect;
  uStack_120 = 0;
  local_118 = makeSwitch;
  uStack_110 = 0;
  local_30 = 2;
  local_18 = 2;
  local_108 = makeDrop;
  uStack_100 = 0;
  local_f8 = makeReturn;
  uStack_f0 = 0;
  weightedOption.weight = 4;
  weightedOption._0_16_ = ZEXT816(0x152e5e);
  rest.weight = 2;
  rest._0_16_ = ZEXT816(0x1520e6);
  rest_1.weight = 2;
  rest_1._0_16_ = ZEXT816(0x153aaa);
  rest_2.weight = 2;
  rest_2._0_16_ = ZEXT816(0x153b30);
  rest_3.weight = 2;
  rest_3._0_16_ = ZEXT816(0x153ca0);
  rest_4.weight = 2;
  rest_4._0_16_ = ZEXT816(0x15660e);
  rest_5.weight = 2;
  rest_5._0_16_ = ZEXT816(0x1544a0);
  rest_6.weight = 2;
  rest_6._0_16_ = ZEXT816(0x154b92);
  rest_7.weight = 2;
  rest_7._0_16_ = ZEXT816(0x156886);
  local_158._M_impl.super__Rb_tree_header._M_header._M_right =
       local_158._M_impl.super__Rb_tree_header._M_header._M_left;
  this_00 = Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
            add<wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                      ((FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                        *)&local_158,(FeatureSet)0x0,weightedOption,rest,rest_1,rest_2,rest_3,rest_4
                       ,rest_5,rest_6,rest_7,0x153eb4,0,0x154098,0,0x154ff2,0);
  Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
            (this_00,(FeatureSet)0x500,0x1542f4);
  pcVar1 = (code *)_wasm__TranslateToFuzzReader___constwasm__Random__pick<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_wasm__Random__FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>___
                             (&this->random,
                              (FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                               *)&local_158);
  plVar3 = (long *)((long)&this->wasm + extraout_RDX);
  if (((ulong)pcVar1 & 1) != 0) {
    pcVar1 = *(code **)(pcVar1 + *plVar3 + -1);
  }
  pEVar2 = (Expression *)(*pcVar1)(plVar3,1);
  std::
  _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>_>
  ::~_Rb_tree(&local_158);
  return pEVar2;
}

Assistant:

Expression* TranslateToFuzzReader::_makeunreachable() {
  using Self = TranslateToFuzzReader;
  auto options = FeatureOptions<Expression* (Self::*)(Type)>();
  using WeightedOption = decltype(options)::WeightedOption;
  options
    .add(FeatureSet::MVP,
         WeightedOption{&Self::makeLocalSet, VeryImportant},
         WeightedOption{&Self::makeBlock, Important},
         WeightedOption{&Self::makeIf, Important},
         WeightedOption{&Self::makeLoop, Important},
         WeightedOption{&Self::makeBreak, Important},
         WeightedOption{&Self::makeStore, Important},
         WeightedOption{&Self::makeUnary, Important},
         WeightedOption{&Self::makeBinary, Important},
         WeightedOption{&Self::makeUnreachable, Important},
         &Self::makeCall,
         &Self::makeCallIndirect,
         &Self::makeSelect,
         &Self::makeSwitch,
         &Self::makeDrop,
         &Self::makeReturn)
    .add(FeatureSet::GC | FeatureSet::ReferenceTypes, &Self::makeCallRef);
  return (this->*pick(options))(Type::unreachable);
}